

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O0

undefined8 rcg::anon_unknown_4::toLower(string *s,size_t start,size_t size)

{
  int iVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 in_RDI;
  size_t end;
  ostringstream out;
  unsigned_long local_1b0;
  unsigned_long local_1a8;
  ulong local_1a0;
  ostringstream local_198 [376];
  long local_20;
  ulong local_18;
  ulong local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a8 = std::__cxx11::string::size();
  local_1b0 = local_18 + local_20;
  puVar2 = std::min<unsigned_long>(&local_1a8,&local_1b0);
  local_1a0 = *puVar2;
  while (local_18 < local_1a0) {
    local_18 = local_18 + 1;
    pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
    iVar1 = tolower((int)*pcVar3);
    std::operator<<((ostream *)local_198,(char)iVar1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

inline std::string toLower(const std::string &s, size_t start, size_t size)
{
  std::ostringstream out;

  size_t end=std::min(s.size(), start+size);

  while (start < end)
  {
    out << static_cast<char>(std::tolower(s[start++]));
  }

  return out.str();
}